

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O3

void absl::lts_20240722::flags_internal::MaybeExit(HelpMode mode)

{
  if (mode == kNone) {
    return;
  }
  if (mode - kVersion < 2) {
    exit(0);
  }
  exit(1);
}

Assistant:

void MaybeExit(HelpMode mode) {
  switch (mode) {
    case flags_internal::HelpMode::kNone:
      return;
    case flags_internal::HelpMode::kOnlyCheckArgs:
    case flags_internal::HelpMode::kVersion:
      std::exit(0);
    default:  // For all the other modes we exit with 1
      std::exit(1);
  }
}